

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Amr.cpp
# Opt level: O1

void __thiscall
amrex::Amr::timeStep(Amr *this,int level,Real time,int iteration,int niter,Real stop_time)

{
  int *piVar1;
  ostringstream *poVar2;
  double dVar3;
  int iVar4;
  uint uVar5;
  __uniq_ptr_data<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>,_true,_true> _Var6;
  pointer pdVar7;
  pointer piVar8;
  bool bVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  long lVar13;
  int level_00;
  uint uVar14;
  ulong uVar15;
  int iVar16;
  long lVar17;
  uint uVar18;
  long lVar19;
  double dVar20;
  Print local_1b8;
  
  this->which_level_being_advanced = level;
  uVar15 = (ulong)level;
  *(undefined4 *)
   ((long)(this->amr_level).
          super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
          .
          super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start[uVar15]._M_t.
          super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_> + 0x20c) = 0
  ;
  iVar16 = (this->super_AmrCore).super_AmrMesh.super_AmrInfo.max_level;
  if ((iVar16 == 0) && ((anonymous_namespace)::regrid_on_restart != 0)) {
    (*(this->super_AmrCore).super_AmrMesh._vptr_AmrMesh[0x10])(this);
  }
  else {
    iVar16 = iVar16 + -1;
    iVar4 = *(int *)&(this->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c;
    if (iVar4 <= iVar16) {
      iVar16 = iVar4;
    }
    if (level <= iVar16) {
      lVar17 = uVar15 - 1;
      uVar12 = uVar15;
      do {
        iVar4 = *(int *)&(this->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c;
        lVar19 = (long)iVar4;
        level_00 = (int)uVar12;
        bVar9 = okToRegrid(this,level_00);
        if (bVar9) {
          (*(this->super_AmrCore).super_AmrMesh._vptr_AmrMesh[7])(time,this,uVar12 & 0xffffffff,0);
          if ((level_00 == 0) && (compute_new_dt_on_regrid != 0)) {
            _Var6.super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>._M_t
            .super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
            super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl =
                 (((this->amr_level).
                   super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                   .
                   super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                 super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>;
            (**(code **)(*(long *)_Var6.
                                  super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                                  .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl +
                        0x70))(stop_time,
                               _Var6.
                               super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                               .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl,
                               *(undefined4 *)
                                &(this->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c,
                               this->sub_cycle,&this->n_cycle,
                               &(this->super_AmrCore).super_AmrMesh.super_AmrInfo.ref_ratio,
                               &this->dt_min,&this->dt_level,1);
          }
          iVar10 = *(int *)&(this->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c;
          if (level_00 <= iVar10) {
            piVar8 = (this->level_count).super_vector<int,_std::allocator<int>_>.
                     super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                     _M_start;
            lVar13 = lVar17;
            do {
              piVar8[lVar13 + 1] = 0;
              iVar10 = *(int *)&(this->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c;
              lVar13 = lVar13 + 1;
            } while (lVar13 < iVar10);
          }
          if (iVar4 < iVar10) {
            pdVar7 = (this->dt_level).super_vector<double,_std::allocator<double>_>.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            piVar8 = (this->n_cycle).super_vector<int,_std::allocator<int>_>.
                     super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                     _M_start;
            dVar20 = pdVar7[lVar19];
            do {
              dVar20 = dVar20 / (double)piVar8[lVar19 + 1];
              pdVar7[lVar19 + 1] = dVar20;
              lVar19 = lVar19 + 1;
            } while (iVar10 != lVar19);
          }
        }
        iVar10 = *(int *)&(this->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c;
        iVar11 = (this->super_AmrCore).super_AmrMesh.super_AmrInfo.max_level + -1;
        if (iVar10 <= iVar11) {
          iVar11 = iVar10;
        }
        if (iVar10 < iVar4) {
          iVar16 = iVar11;
        }
        uVar12 = uVar12 + 1;
        lVar17 = lVar17 + 1;
      } while (level_00 < iVar16);
    }
    if (((((this->super_AmrCore).super_AmrMesh.super_AmrInfo.max_level == 0) &&
         (0 < this->loadbalance_level0_int)) && (this->loadbalance_with_workestimates != 0)) &&
       ((*(this->level_steps).super_vector<int,_std::allocator<int>_>.
          super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start ==
         1 || (this->loadbalance_level0_int <=
               *(this->level_count).super_vector<int,_std::allocator<int>_>.
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start)))) {
      LoadBalanceLevel0(this,time);
      *(this->level_count).super_vector<int,_std::allocator<int>_>.
       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start = 0;
    }
  }
  if (((anonymous_namespace)::plotfile_on_restart != 0) &&
     ((this->restart_chkfile)._M_string_length != 0)) {
    (anonymous_namespace)::plotfile_on_restart = 0;
    (*(this->super_AmrCore).super_AmrMesh._vptr_AmrMesh[0xd])(this);
  }
  if (0 < (this->super_AmrCore).super_AmrMesh.super_AmrInfo.verbose) {
    local_1b8.os = OutStream();
    local_1b8.rank = *(int *)(DAT_00756620 + -0x30);
    poVar2 = &local_1b8.ss;
    local_1b8.comm = *(MPI_Comm *)(DAT_00756620 + -0x48);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar2);
    *(undefined8 *)(&local_1b8.field_0x18 + *(long *)(local_1b8._16_8_ + -0x18)) =
         *(undefined8 *)(local_1b8.os + *(long *)(*(long *)local_1b8.os + -0x18) + 8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"[Level ",7);
    std::ostream::operator<<(poVar2,level);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2," step ",6);
    std::ostream::operator<<
              (poVar2,(this->level_steps).super_vector<int,_std::allocator<int>_>.
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                      _M_start[uVar15] + 1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"] ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"ADVANCE with dt = ",0x12);
    std::ostream::_M_insert<double>
              ((this->dt_level).super_vector<double,_std::allocator<double>_>.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start[uVar15]);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"\n",1);
    Print::~Print(&local_1b8);
  }
  _Var6.super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>._M_t.
  super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
  super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl =
       (this->amr_level).
       super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
       .
       super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start[uVar15]._M_t.
       super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>;
  dVar20 = (double)(**(code **)(*(long *)_Var6.
                                         super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                                         .super__Head_base<0UL,_amrex::AmrLevel_*,_false>.
                                         _M_head_impl + 0x78))
                             (time,(this->dt_level).super_vector<double,_std::allocator<double>_>.
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                   super__Vector_impl_data._M_start[uVar15],
                              _Var6.
                              super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                              .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl,
                              iteration,niter);
  if ((iteration != 1) &&
     (dVar3 = (this->dt_min).super_vector<double,_std::allocator<double>_>.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start[uVar15], dVar3 <= dVar20)) {
    dVar20 = dVar3;
  }
  (this->dt_min).super_vector<double,_std::allocator<double>_>.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
  [uVar15] = dVar20;
  piVar1 = (this->level_steps).super_vector<int,_std::allocator<int>_>.
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start +
           uVar15;
  *piVar1 = *piVar1 + 1;
  piVar1 = (this->level_count).super_vector<int,_std::allocator<int>_>.
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start +
           uVar15;
  *piVar1 = *piVar1 + 1;
  if (0 < (this->super_AmrCore).super_AmrMesh.super_AmrInfo.verbose) {
    local_1b8.os = OutStream();
    local_1b8.rank = *(int *)(DAT_00756620 + -0x30);
    poVar2 = &local_1b8.ss;
    local_1b8.comm = *(MPI_Comm *)(DAT_00756620 + -0x48);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar2);
    *(undefined8 *)(&local_1b8.field_0x18 + *(long *)(local_1b8._16_8_ + -0x18)) =
         *(undefined8 *)(local_1b8.os + *(long *)(*(long *)local_1b8.os + -0x18) + 8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"[Level ",7);
    std::ostream::operator<<(poVar2,level);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2," step ",6);
    std::ostream::operator<<
              (poVar2,(this->level_steps).super_vector<int,_std::allocator<int>_>.
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                      _M_start[uVar15]);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"] ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"Advanced ",9);
    AmrLevel::countCells
              ((AmrLevel *)
               (this->amr_level).
               super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
               .
               super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar15]._M_t.
               super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>);
    std::ostream::_M_insert<long>((long)poVar2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2," cells\n",7);
    Print::~Print(&local_1b8);
  }
  if (*(int *)((long)(this->amr_level).
                     super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                     .
                     super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar15]._M_t.
                     super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_> +
              0x20c) != 0) {
    iVar16 = *(int *)&(this->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c;
    lVar17 = (long)iVar16;
    (*(this->super_AmrCore).super_AmrMesh._vptr_AmrMesh[7])
              (time,stop_time,this,(ulong)(uint)level,0);
    iVar4 = *(int *)&(this->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c;
    if (iVar16 < iVar4) {
      pdVar7 = (this->dt_level).super_vector<double,_std::allocator<double>_>.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
      piVar8 = (this->n_cycle).super_vector<int,_std::allocator<int>_>.
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start;
      dVar20 = pdVar7[lVar17];
      do {
        dVar20 = dVar20 / (double)piVar8[lVar17 + 1];
        pdVar7[lVar17 + 1] = dVar20;
        lVar17 = lVar17 + 1;
      } while (iVar4 != lVar17);
    }
  }
  if (level < *(int *)&(this->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c) {
    uVar14 = level + 1;
    if (this->sub_cycle == 0) {
      (*(this->super_AmrCore).super_AmrMesh._vptr_AmrMesh[0x11])
                (time,stop_time,this,(ulong)uVar14,1,1);
    }
    else {
      uVar5 = (this->n_cycle).super_vector<int,_std::allocator<int>_>.
              super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
              [(int)uVar14];
      if (0 < (int)uVar5) {
        uVar18 = 0;
        do {
          dVar20 = (double)(int)uVar18;
          uVar18 = uVar18 + 1;
          (*(this->super_AmrCore).super_AmrMesh._vptr_AmrMesh[0x11])
                    (dVar20 * (this->dt_level).super_vector<double,_std::allocator<double>_>.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start[(int)uVar14] + time,stop_time,this,
                     (ulong)uVar14,(ulong)uVar18,(ulong)uVar5);
        } while (uVar5 != uVar18);
      }
    }
  }
  _Var6.super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>._M_t.
  super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
  super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl =
       (this->amr_level).
       super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
       .
       super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start[uVar15]._M_t.
       super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>;
  (**(code **)(*(long *)_Var6.
                        super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                        .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl + 0x80))
            (_Var6.super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>.
             _M_t.super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
             super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl,iteration);
  this->which_level_being_advanced = -1;
  return;
}

Assistant:

void
Amr::timeStep (int  level,
               Real time,
               int  iteration,
               int  niter,
               Real stop_time)
{
    BL_PROFILE("Amr::timeStep()");
    BL_COMM_PROFILE_NAMETAG("Amr::timeStep TOP");

    // This is used so that the AmrLevel functions can know which level is being advanced
    //      when regridding is called with possible lbase > level.
    which_level_being_advanced = level;


    // Update so that by default, we don't force a post-step regrid.
    amr_level[level]->setPostStepRegrid(0);

    //
    // Allow regridding of level 0 calculation on restart.
    //
    if (max_level == 0 && regrid_on_restart)
    {
        regrid_level_0_on_restart();
    }
    else
    {
        int lev_top = std::min(finest_level, max_level-1);
        for (int i(level); i <= lev_top; ++i)
        {
            const int old_finest = finest_level;

            if (okToRegrid(i))
            {
                regrid(i,time);

                //
                // Compute new dt after regrid if at level 0 and compute_new_dt_on_regrid.
                //
                if ( compute_new_dt_on_regrid && (i == 0) )
                {
                    int post_regrid_flag = 1;
                    amr_level[0]->computeNewDt(finest_level,
                                               sub_cycle,
                                               n_cycle,
                                               ref_ratio,
                                               dt_min,
                                               dt_level,
                                               stop_time,
                                               post_regrid_flag);
                }

                for (int k(i); k <= finest_level; ++k) {
                    level_count[k] = 0;
                }

                if (old_finest < finest_level)
                {
                    //
                    // The new levels will not have valid time steps
                    // and iteration counts.
                    //
                    for (int k(old_finest + 1); k <= finest_level; ++k)
                    {
                        dt_level[k]    = dt_level[k-1]/n_cycle[k];
                    }
                }
            }
            if (old_finest > finest_level) {
                lev_top = std::min(finest_level, max_level - 1);
            }
        }

        if (max_level == 0 && loadbalance_level0_int > 0 && loadbalance_with_workestimates)
        {
            if (level_steps[0] == 1 || level_count[0] >= loadbalance_level0_int) {
                LoadBalanceLevel0(time);
                level_count[0] = 0;
            }
        }
    }
    //
    // Check to see if should write plotfile.
    // This routine is here so it is done after the restart regrid.
    //
    if (plotfile_on_restart && ! (restart_chkfile.empty()) )
    {
        plotfile_on_restart = 0;
        writePlotFile();
    }
    //
    // Advance grids at this level.
    //
    if (verbose > 0)
    {
        amrex::Print() << "[Level " << level << " step " << level_steps[level]+1 << "] "
                       << "ADVANCE with dt = " << dt_level[level] << "\n";
    }

    Real dt_new = amr_level[level]->advance(time,dt_level[level],iteration,niter);
    BL_PROFILE_REGION_STOP("amr_level.advance");

    dt_min[level] = iteration == 1 ? dt_new : std::min(dt_min[level],dt_new);

    level_steps[level]++;
    level_count[level]++;

    if (verbose > 0)
    {
        amrex::Print() << "[Level " << level << " step " << level_steps[level] << "] "
                       << "Advanced " << amr_level[level]->countCells() << " cells\n";
    }

    // If the level signified that it wants a regrid after the advance has
    // occurred, do that now.
    if (amr_level[level]->postStepRegrid()) {

        int old_finest = finest_level;

        regrid(level, time);

        if (old_finest < finest_level)
        {
            //
            // The new levels will not have valid time steps.
            //
            for (int k = old_finest + 1; k <= finest_level; ++k)
            {
                dt_level[k] = dt_level[k-1] / n_cycle[k];
            }
        }
    }

    //
    // Advance grids at higher level.
    //
    if (level < finest_level)
    {
        const int lev_fine = level+1;

        if (sub_cycle)
        {
            const int ncycle = n_cycle[lev_fine];

            BL_COMM_PROFILE_NAMETAG("Amr::timeStep timeStep subcycle");
            for (int i = 1; i <= ncycle; i++)
                timeStep(lev_fine,time+(i-1)*dt_level[lev_fine],i,ncycle,stop_time);
        }
        else
        {
            BL_COMM_PROFILE_NAMETAG("Amr::timeStep timeStep nosubcycle");
            timeStep(lev_fine,time,1,1,stop_time);
        }
    }

    amr_level[level]->post_timestep(iteration);

    // Set this back to negative so we know whether we are in fact in this routine
    which_level_being_advanced = -1;
}